

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapNSNormGatherInScopeNs(xmlNsMapPtr *map,xmlNodePtr node)

{
  xmlChar *str2;
  bool bVar1;
  int iVar2;
  xmlNsMapItemPtr_conflict pxVar3;
  _xmlNs *newNs;
  
  iVar2 = -1;
  if ((((map != (xmlNsMapPtr *)0x0) && (node != (xmlNodePtr)0x0)) && (*map == (xmlNsMapPtr)0x0)) &&
     (node->type != XML_NAMESPACE_DECL)) {
    for (; (node != (xmlNodePtr)0x0 && ((_xmlDoc *)node != ((_xmlDoc *)node)->doc));
        node = ((_xmlDoc *)node)->parent) {
      if (((_xmlDoc *)node)->type == XML_ELEMENT_NODE) {
        for (newNs = ((_xmlDoc *)node)->oldNs; newNs != (xmlNsPtr)0x0; newNs = newNs->next) {
          bVar1 = true;
          if (*map != (xmlNsMapPtr)0x0) {
            for (pxVar3 = (*map)->first; pxVar3 != (xmlNsMapItemPtr_conflict)0x0;
                pxVar3 = pxVar3->next) {
              str2 = pxVar3->newNs->prefix;
              if ((newNs->prefix == str2) || (iVar2 = xmlStrEqual(newNs->prefix,str2), iVar2 != 0))
              {
                bVar1 = false;
                break;
              }
            }
          }
          pxVar3 = xmlDOMWrapNsMapAddItem(map,0,(xmlNsPtr)0x0,newNs,-1);
          if (pxVar3 == (xmlNsMapItemPtr_conflict)0x0) {
            return -1;
          }
          if (!bVar1) {
            pxVar3->shadowDepth = 0;
          }
        }
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlDOMWrapNSNormGatherInScopeNs(xmlNsMapPtr *map,
				xmlNodePtr node)
{
    xmlNodePtr cur;
    xmlNsPtr ns;
    xmlNsMapItemPtr mi;
    int shadowed;

    if ((map == NULL) || (*map != NULL))
	return (-1);
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return (-1);
    /*
    * Get in-scope ns-decls of @parent.
    */
    cur = node;
    while ((cur != NULL) && (cur != (xmlNodePtr) cur->doc)) {
	if (cur->type == XML_ELEMENT_NODE) {
	    if (cur->nsDef != NULL) {
		ns = cur->nsDef;
		do {
		    shadowed = 0;
		    if (XML_NSMAP_NOTEMPTY(*map)) {
			/*
			* Skip shadowed prefixes.
			*/
			XML_NSMAP_FOREACH(*map, mi) {
			    if ((ns->prefix == mi->newNs->prefix) ||
				xmlStrEqual(ns->prefix, mi->newNs->prefix)) {
				shadowed = 1;
				break;
			    }
			}
		    }
		    /*
		    * Insert mapping.
		    */
		    mi = xmlDOMWrapNsMapAddItem(map, 0, NULL,
			ns, XML_TREE_NSMAP_PARENT);
		    if (mi == NULL)
			return (-1);
		    if (shadowed)
			mi->shadowDepth = 0;
		    ns = ns->next;
		} while (ns != NULL);
	    }
	}
	cur = cur->parent;
    }
    return (0);
}